

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Glucose::Clause::Clause<Glucose::vec<Glucose::Lit>>
          (Clause *this,vec<Glucose::Lit> *ps,int _extra_size,bool learnt)

{
  uint uVar1;
  Lit *pLVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  int i;
  long lVar4;
  
  uVar3 = (ulong)((_extra_size & 3U) * 0x10 + (int)CONCAT71(in_register_00000009,learnt) * 4) |
          *(ulong *)&this->header & 0xffffffffffffff48;
  *(ulong *)&this->header = uVar3;
  uVar1 = ps->sz;
  uVar3 = (CONCAT44(uVar1,(int)uVar3) & 0xffffffff80000034) + 8;
  *(ulong *)&this->header = uVar3;
  pLVar2 = ps->data;
  for (lVar4 = 0; lVar4 < ps->sz; lVar4 = lVar4 + 1) {
    *(int *)(&this[1].header.field_0x0 + lVar4 * 4) = pLVar2[lVar4].x;
  }
  if ((_extra_size & 3U) != 0) {
    if (learnt) {
      *(undefined4 *)(&this[1].header.field_0x0 + (ulong)uVar1 * 4) = 0;
    }
    else {
      calcAbstraction(this);
      uVar3 = *(ulong *)&this->header;
    }
    if ((uVar3 & 0x20) != 0) {
      *(undefined4 *)(&this[1].header.field_0x0 + (ulong)((int)(uVar3 >> 0x20) + 1) * 4) = 0;
    }
  }
  return;
}

Assistant:

Clause(const V& ps, int _extra_size, bool learnt) {
	assert(_extra_size < (1<<2));
        header.mark      = 0;
        header.learnt    = learnt;
        header.extra_size = _extra_size;
            header.reloced   = 0;
        header.size      = ps.size();
	header.lbd = 0;
	header.canbedel = 1;
	header.exported = 0; 
	header.oneWatched = 0;
	header.seen = 0;
        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];
	
        if (header.extra_size > 0){
	  if (header.learnt) 
                data[header.size].act = 0; 
            else 
                calcAbstraction();
	  if (header.extra_size > 1) {
	      data[header.size+1].abs = 0; // learntFrom
	  }	      
	}
    }